

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.h
# Opt level: O0

cmTargetLinkLibraryType
CMP0003_ComputeLinkType
          (string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *debugConfigs)

{
  bool bVar1;
  ulong uVar2;
  undefined1 local_40 [8];
  string configUpper;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *debugConfigs_local;
  string *config_local;
  
  configUpper.field_2._8_8_ = debugConfigs;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::UpperCase((string *)local_40,config);
    bVar1 = cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)configUpper.field_2._8_8_,(string *)local_40);
    if (bVar1) {
      config_local._4_4_ = DEBUG_LibraryType;
    }
    else {
      config_local._4_4_ = OPTIMIZED_LibraryType;
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    config_local._4_4_ = OPTIMIZED_LibraryType;
  }
  return config_local._4_4_;
}

Assistant:

inline cmTargetLinkLibraryType CMP0003_ComputeLinkType(
  const std::string& config, std::vector<std::string> const& debugConfigs)
{
  // No configuration is always optimized.
  if (config.empty()) {
    return OPTIMIZED_LibraryType;
  }

  // Check if any entry in the list matches this configuration.
  std::string configUpper = cmSystemTools::UpperCase(config);
  if (cm::contains(debugConfigs, configUpper)) {
    return DEBUG_LibraryType;
  }
  // The current configuration is not a debug configuration.
  return OPTIMIZED_LibraryType;
}